

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAddressCode.cpp
# Opt level: O1

void MyCompiler::traverseIdentsTerm
               (Term *ast,
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *usedIdents)

{
  pointer ppVar1;
  pair<MyCompiler::MulDivOp,_MyCompiler::Factor> *item;
  pointer ppVar2;
  
  traverseIdentsFactor
            ((ast->pFactor).super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,usedIdents);
  ppVar1 = (ast->vMulDivOpFactor).
           super__Vector_base<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar2 = (ast->vMulDivOpFactor).
                super__Vector_base<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1) {
    traverseIdentsFactor(&ppVar2->second,usedIdents);
  }
  return;
}

Assistant:

void MyCompiler::traverseIdentsTerm(MyCompiler::Term &ast,
                                    std::unordered_set<std::string> &usedIdents)
{
    traverseIdentsFactor(*ast.pFactor, usedIdents);
    for (auto &item : ast.vMulDivOpFactor)
        traverseIdentsFactor(item.second, usedIdents);
}